

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O2

QRegion __thiscall QRegion::intersected(QRegion *this,QRegion *r)

{
  int iVar1;
  QRegionPrivate *pQVar2;
  bool bVar3;
  QRegionData *pQVar4;
  QRegion *in_RDX;
  QRegionPrivate *pQVar5;
  long in_FS_OFFSET;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = r->d->qt_rgn;
  if (((((pQVar5 != (QRegionPrivate *)0x0) && (pQVar5->numRects != 0)) &&
       (pQVar2 = in_RDX->d->qt_rgn, pQVar2 != (QRegionPrivate *)0x0)) &&
      ((pQVar2->numRects != 0 && ((pQVar2->extents).x1.m_i <= (pQVar5->extents).x2.m_i)))) &&
     (((pQVar5->extents).x1.m_i <= (pQVar2->extents).x2.m_i &&
      (((pQVar2->extents).y1.m_i <= (pQVar5->extents).y2.m_i &&
       ((pQVar5->extents).y1.m_i <= (pQVar2->extents).y2.m_i)))))) {
    bVar3 = QRegionPrivate::contains(pQVar2,&pQVar5->extents);
    if (bVar3) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003d040b;
    }
    else {
      bVar3 = QRegionPrivate::contains(r->d->qt_rgn,&in_RDX->d->qt_rgn->extents);
      if (!bVar3) {
        pQVar5 = in_RDX->d->qt_rgn;
        pQVar2 = r->d->qt_rgn;
        iVar1 = pQVar2->numRects;
        if (pQVar5->numRects == 1) {
          if (iVar1 == 1) {
            local_30 = qt_rect_intersect_normalized(&pQVar5->extents,&pQVar2->extents);
            QRegion(this,&local_30,Rectangle);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
              return (QRegion)(QRegionData *)this;
            }
            goto LAB_003d040b;
          }
          this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion(this,r);
          detach(this);
          pQVar5 = this->d->qt_rgn;
          pQVar4 = in_RDX->d;
        }
        else {
          this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          if (iVar1 != 1) {
            QRegion(this);
            detach(this);
            miRegionOp(this->d->qt_rgn,r->d->qt_rgn,in_RDX->d->qt_rgn,miIntersectO,
                       (NonOverlapFunc)0x0,(NonOverlapFunc)0x0);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
              miSetExtents(this->d->qt_rgn);
              return (QRegion)(QRegionData *)this;
            }
            goto LAB_003d040b;
          }
          QRegion(this,in_RDX);
          detach(this);
          pQVar5 = this->d->qt_rgn;
          pQVar4 = r->d;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          QRegionPrivate::intersect(pQVar5,&pQVar4->qt_rgn->extents);
          return (QRegion)(QRegionData *)this;
        }
        goto LAB_003d040b;
      }
      r = in_RDX;
      if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_003d040b;
    }
    QRegion(this,r);
    return (QRegion)(QRegionData *)this;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    QRegion(this);
    return (QRegion)(QRegionData *)this;
  }
LAB_003d040b:
  __stack_chk_fail();
}

Assistant:

QRegion QRegion::intersected(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn) || isEmptyHelper(r.d->qt_rgn)
        || !EXTENTCHECK(&d->qt_rgn->extents, &r.d->qt_rgn->extents))
        return QRegion();

    /* this is fully contained in r */
    if (r.d->qt_rgn->contains(*d->qt_rgn))
        return *this;

    /* r is fully contained in this */
    if (d->qt_rgn->contains(*r.d->qt_rgn))
        return r;

    if (r.d->qt_rgn->numRects == 1 && d->qt_rgn->numRects == 1) {
        const QRect rect = qt_rect_intersect_normalized(r.d->qt_rgn->extents,
                                                        d->qt_rgn->extents);
        return QRegion(rect);
    } else if (r.d->qt_rgn->numRects == 1) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->intersect(r.d->qt_rgn->extents);
        return result;
    } else if (d->qt_rgn->numRects == 1) {
        QRegion result(r);
        result.detach();
        result.d->qt_rgn->intersect(d->qt_rgn->extents);
        return result;
    }

    QRegion result;
    result.detach();
    miRegionOp(*result.d->qt_rgn, d->qt_rgn, r.d->qt_rgn, miIntersectO, nullptr, nullptr);

    /*
     * Can't alter dest's extents before we call miRegionOp because
     * it might be one of the source regions and miRegionOp depends
     * on the extents of those regions being the same. Besides, this
     * way there's no checking against rectangles that will be nuked
     * due to coalescing, so we have to examine fewer rectangles.
     */
    miSetExtents(*result.d->qt_rgn);
    return result;
}